

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

bool embree::TutorialBenchmark::benchmark(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  allocator local_55;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar4 = 0;
  if (0 < argc) {
    uVar4 = (ulong)(uint)argc;
  }
  uVar1 = 0;
  local_54 = argc;
  do {
    uVar3 = uVar1;
    if (uVar4 == uVar3) break;
    std::__cxx11::string::string((string *)&local_50,argv[uVar3],&local_55);
    bVar2 = std::operator==(&local_50,"--benchmark");
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = uVar3 + 1;
  } while (!bVar2);
  return (long)uVar3 < (long)local_54;
}

Assistant:

static bool benchmark(int argc, char** argv) {
    for (int i = 0; i < argc; ++i)
      if (std::string(argv[i]) == "--benchmark")
        return true;
    return false;
  }